

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptMath.cpp
# Opt level: O2

Var Js::JavascriptMath::Add_InPlace
              (Var aLeft,Var aRight,ScriptContext *scriptContext,JavascriptNumber *result)

{
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  undefined4 *puVar4;
  int64 iVar5;
  int64 iVar6;
  Var pvVar7;
  JavascriptNumber *pJVar8;
  double dVar9;
  double dVar10;
  
  if (aLeft == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/../Math/JavascriptMath.cpp"
                                ,0x17d,"(aLeft != nullptr)","aLeft != nullptr");
    if (!bVar2) goto LAB_00991591;
    *puVar4 = 0;
  }
  if (aRight == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/../Math/JavascriptMath.cpp"
                                ,0x17e,"(aRight != nullptr)","aRight != nullptr");
    if (!bVar2) goto LAB_00991591;
    *puVar4 = 0;
  }
  if (scriptContext == (ScriptContext *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/../Math/JavascriptMath.cpp"
                                ,0x17f,"(scriptContext != nullptr)","scriptContext != nullptr");
    if (!bVar2) goto LAB_00991591;
    *puVar4 = 0;
  }
  if (result == (JavascriptNumber *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/../Math/JavascriptMath.cpp"
                                ,0x180,"(result != nullptr)","result != nullptr");
    if (!bVar2) {
LAB_00991591:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  bVar2 = TaggedInt::Is(aLeft);
  bVar3 = TaggedInt::Is(aRight);
  if (bVar2) {
    if (bVar3) {
      iVar5 = TaggedInt::ToInt64(aLeft);
      iVar6 = TaggedInt::ToInt64(aRight);
      pvVar7 = JavascriptNumber::ToVarInPlace(iVar5 + iVar6,scriptContext,result);
      return pvVar7;
    }
    if ((ulong)aRight >> 0x32 == 0) goto LAB_0099156f;
    dVar9 = (double)(int)aLeft;
  }
  else {
    if (bVar3) {
      if (aLeft < (Var)0x4000000000000) {
LAB_0099156f:
        pvVar7 = Add_FullHelper_Wrapper(aLeft,aRight,scriptContext,result,false);
        return pvVar7;
      }
      dVar10 = JavascriptNumber::GetValue(aLeft);
      dVar10 = dVar10 + (double)(int)aRight;
      goto LAB_00991556;
    }
    if (aRight < (Var)0x4000000000000 || aLeft < (Var)0x4000000000000) goto LAB_0099156f;
    dVar9 = JavascriptNumber::GetValue(aLeft);
  }
  dVar10 = JavascriptNumber::GetValue(aRight);
  dVar10 = dVar10 + dVar9;
LAB_00991556:
  pJVar8 = JavascriptNumber::InPlaceNew(dVar10,scriptContext,result);
  return pJVar8;
}

Assistant:

Var JavascriptMath::Add_InPlace(Var aLeft, Var aRight, ScriptContext* scriptContext, JavascriptNumber* result)
        {
            JIT_HELPER_REENTRANT_HEADER(Op_AddInPlace);
            Assert(aLeft != nullptr);
            Assert(aRight != nullptr);
            Assert(scriptContext != nullptr);
            Assert(result != nullptr);

            // If both sides are numbers, then we can do the addition directly, otherwise
            // we need to call the helper.
            if( TaggedInt::Is(aLeft) )
            {
                if( TaggedInt::Is(aRight) )
                {
                    // Compute the sum using integer addition, then convert to double.
                    // That way there's only one int->float conversion.
#if INT32VAR
                    int64 sum = TaggedInt::ToInt64(aLeft) + TaggedInt::ToInt64(aRight);
#else
                    int32 sum = TaggedInt::ToInt32(aLeft) + TaggedInt::ToInt32(aRight);
#endif

                    return JavascriptNumber::ToVarInPlace(sum, scriptContext, result);
                }
                else if( JavascriptNumber::Is_NoTaggedIntCheck(aRight) )
                {
                    double sum = TaggedInt::ToDouble(aLeft) + JavascriptNumber::GetValue(aRight);
                    return JavascriptNumber::InPlaceNew( sum, scriptContext, result );
                }
            }
            else if( TaggedInt::Is(aRight) )
            {
                if( JavascriptNumber::Is_NoTaggedIntCheck(aLeft) )
                {
                    double sum = JavascriptNumber::GetValue(aLeft) + TaggedInt::ToDouble(aRight);
                    return JavascriptNumber::InPlaceNew( sum, scriptContext, result );
                }
            }
            else if( JavascriptNumber::Is_NoTaggedIntCheck(aLeft) && JavascriptNumber::Is_NoTaggedIntCheck(aRight) )
            {
                double sum = JavascriptNumber::GetValue(aLeft) + JavascriptNumber::GetValue(aRight);
                return JavascriptNumber::InPlaceNew( sum, scriptContext, result );
            }

            return Add_FullHelper_Wrapper(aLeft, aRight, scriptContext, result, false);
            JIT_HELPER_END(Op_AddInPlace);
        }